

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O2

string_t __thiscall
duckdb::
OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
::CopyString(OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
             *this,string_t input_str)

{
  data_ptr_t __dest;
  void *__src;
  ulong size;
  uint uVar1;
  string_t sVar2;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  undefined8 local_38;
  void *local_30;
  
  local_38 = input_str.value._0_8_;
  uVar1 = input_str.value._0_4_;
  size = local_38 & 0xffffffff;
  local_30 = input_str.value._8_8_;
  __dest = Allocator::AllocateData(this->allocator,size);
  __src = input_str.value._8_8_;
  if (uVar1 < 0xd) {
    __src = (void *)((long)&local_38 + 4);
  }
  switchD_00916250::default(__dest,__src,size);
  if (uVar1 < 0xd) {
    local_3c = 0;
    uStack_44 = 0;
    uStack_40 = 0;
    if (uVar1 == 0) {
      __dest = (data_ptr_t)0x0;
    }
    else {
      switchD_00916250::default(&uStack_44,__src,size);
      __dest = (data_ptr_t)CONCAT44(local_3c,uStack_40);
    }
  }
  else {
    uStack_44 = *(undefined4 *)__dest;
  }
  sVar2.value._4_1_ = (undefined1)uStack_44;
  sVar2.value._5_1_ = uStack_44._1_1_;
  sVar2.value._6_1_ = uStack_44._2_1_;
  sVar2.value._7_1_ = uStack_44._3_1_;
  sVar2.value.pointer.length = uVar1;
  sVar2.value.pointer.ptr = (char *)__dest;
  return (string_t)sVar2.value;
}

Assistant:

inline string_t CopyString(string_t input_str) {
		D_ASSERT(!input_str.IsInlined());
		// if the string is not inlined we need to allocate space for it
		auto input_str_size = UnsafeNumericCast<uint32_t>(input_str.GetSize());
		auto string_memory = allocator.AllocateData(input_str_size);
		// copy over the string
		memcpy(string_memory, input_str.GetData(), input_str_size);
		// now return the final string_t
		return string_t(char_ptr_cast(string_memory), input_str_size);
	}